

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

int __thiscall
DataContainer::InitUnzip(DataContainer *this,ITypeManager *manager,uchar *zipped_buffer,int size)

{
  NodeFS *__s;
  uchar *puVar1;
  undefined4 uVar2;
  short comp_method_1;
  short flags;
  short min_version_1;
  uchar *local_header;
  undefined4 local_d0;
  allocator<char> local_c9;
  int file_type;
  allocator<char> local_91;
  string local_90;
  NodeFS *local_70;
  NodeFS *added_element;
  char *filename;
  int Comment_size;
  int extra_size;
  int filename_size;
  int off_local_header;
  int efile_attrib;
  int iStack_44;
  short ifile_attrib;
  short comp_method;
  short min_version;
  int cd;
  int offset_dir;
  int nb_central_dir;
  int offset;
  int offset_eocd;
  int return_value;
  int size_local;
  uchar *zipped_buffer_local;
  ITypeManager *manager_local;
  DataContainer *this_local;
  
  offset = -1;
  nb_central_dir = -1;
  for (offset_dir = size + -1; -1 < offset_dir && nb_central_dir == -1; offset_dir = offset_dir + -1
      ) {
    if (*(int *)(zipped_buffer + offset_dir) == 0x6054b50) {
      nb_central_dir = offset_dir;
    }
  }
  if (nb_central_dir != -1) {
    offset = 0;
    cd = (int)*(short *)(zipped_buffer + (nb_central_dir + 8));
    _comp_method = *(int *)(zipped_buffer + (nb_central_dir + 0x10));
    offset_eocd = size;
    _return_value = zipped_buffer;
    zipped_buffer_local = (uchar *)manager;
    manager_local = (ITypeManager *)this;
    for (iStack_44 = 0; iStack_44 < cd; iStack_44 = iStack_44 + 1) {
      if (*(int *)(_return_value + _comp_method) != 0x2014b50) {
        return -1;
      }
      efile_attrib._2_2_ = *(undefined2 *)(_return_value + (_comp_method + 6));
      efile_attrib._0_2_ = *(undefined2 *)(_return_value + (_comp_method + 10));
      off_local_header._2_2_ = *(undefined2 *)(_return_value + (_comp_method + 0x24));
      filename_size = *(int *)(_return_value + (_comp_method + 0x26));
      extra_size = *(int *)(_return_value + (_comp_method + 0x2a));
      Comment_size = (int)*(short *)(_return_value + (_comp_method + 0x1c));
      filename._4_4_ = (int)*(short *)(_return_value + (_comp_method + 0x1e));
      filename._0_4_ = (int)*(short *)(_return_value + (_comp_method + 0x20));
      added_element = (NodeFS *)operator_new__((long)(Comment_size + 1));
      memcpy(added_element,_return_value + (_comp_method + 0x2e),(long)Comment_size);
      __s = added_element;
      *(undefined1 *)((long)&added_element->_vptr_NodeFS + (long)Comment_size) = 0;
      if (filename_size == 0x10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,(char *)__s,&local_91);
        local_70 = NodeFS::InsertDir(&this->zip_file_,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file_type,(char *)__s,&local_c9);
        local_70 = NodeFS::InsertFile(&this->zip_file_,(string *)&file_type,_return_value);
        std::__cxx11::string::~string((string *)&file_type);
        std::allocator<char>::~allocator(&local_c9);
        puVar1 = zipped_buffer_local;
        local_70->offset_ = extra_size;
        std::__cxx11::string::string((string *)&local_header,(string *)&local_70->name_);
        uVar2 = (*(code *)**(undefined8 **)puVar1)(puVar1,(string *)&local_header);
        std::__cxx11::string::~string((string *)&local_header);
        local_d0 = uVar2;
      }
      if ((*(int *)(_return_value + extra_size) == 0x4034b50) && (local_70 != (NodeFS *)0x0)) {
        local_70->offset_ = extra_size;
      }
      _comp_method = Comment_size + 0x2e + filename._4_4_ + (int)filename + _comp_method;
    }
  }
  return offset;
}

Assistant:

int DataContainer::InitUnzip(ITypeManager* manager, unsigned char* zipped_buffer, int size)
{
   auto return_value = -1;

   // ZIP format : Find EOCD
   int offset_eocd = -1;
   for (int offset = size - 1; offset >= 0 && offset_eocd == -1; offset --)
   {
      if (*(unsigned int*)(&zipped_buffer[offset]) == 0x06054B50)
      {
         offset_eocd = offset;
      }
   }
   if (offset_eocd != -1)
   {
      return_value = 0;
      // Found : Get infos.
      int nb_central_dir = *(short*)&(zipped_buffer[offset_eocd + 8]);
      int offset_dir = *(int*)&(zipped_buffer[offset_eocd + 16]);

      // Now, look at central directories
      for (int cd = 0; cd < nb_central_dir; cd ++)
      {
         // Check signature
         if (*(unsigned int*)(&zipped_buffer[offset_dir]) == 0x02014b50)
         {
            // check version min
            // Compression method
            short min_version = *(short*)&(zipped_buffer[offset_dir + 6]);
            short comp_method = *(short*)&(zipped_buffer[offset_dir + 10]);
            short ifile_attrib = *(short*)&(zipped_buffer[offset_dir + 36]);
            int efile_attrib = *(int*)&(zipped_buffer[offset_dir + 38]);

            //
            int off_local_header = *(int*)&(zipped_buffer[offset_dir + 42]);
            // Sizes
            int filename_size = *(short*)(&zipped_buffer[offset_dir + 28]);
            int extra_size = *(short*)(&zipped_buffer[offset_dir + 30]);
            int Comment_size = *(short*)(&zipped_buffer[offset_dir + 32]);
            char* filename = new char [filename_size + 1];
            memcpy(filename, &zipped_buffer[offset_dir + 46], filename_size);
            filename[filename_size] = 0;

            // Directory ?
            NodeFS* added_element;
            if (efile_attrib == FILE_ATTRIBUTE_DIRECTORY)
            {
               // New node :
               added_element = zip_file_.InsertDir(filename);
            }
            else
            {
               // File
               added_element = zip_file_.InsertFile(filename, zipped_buffer);

               added_element->offset_ = off_local_header;
               // Update file type count
               int file_type = manager->GetTypeFromFile(added_element->name_);
            }

            // local file header
            unsigned char* local_header = &zipped_buffer[off_local_header];
            if (*(unsigned int*)(&local_header[0]) == 0x04034b50)
            {
               short min_version = *(short*)&(local_header[4]);
               short flags = *(short*)&(local_header[6]);
               short comp_method = *(short*)&(local_header[8]);

               if (added_element != nullptr)
               {
                  added_element->offset_ = off_local_header;
               }
            }
            offset_dir += 46 + filename_size + extra_size + Comment_size;
         }
         else
         {
            // Error !
            return -1;
         }
      }
   }
   return return_value;
}